

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.hpp
# Opt level: O1

optional<int32_t> __thiscall Command::Arg::find_constant(Arg *this,string_view *value)

{
  value_type *pvVar1;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,iless,std::allocator<std::pair<std::__cxx11::string_const,int>>>
  *this_00;
  ArgType AVar2;
  const_iterator cVar3;
  basic_string_view<char,_std::char_traits<char>_> *in_RDX;
  value_type *pvVar4;
  bool bVar5;
  bool bVar6;
  
  pvVar4 = (value_type *)value->__size;
  pvVar1 = value[1].__data;
  bVar5 = pvVar4 == pvVar1;
  if (bVar5) {
    AVar2 = this->type;
  }
  else {
    do {
      this_00 = *(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,iless,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                  **)pvVar4;
      cVar3 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,iless,std::allocator<std::pair<std::__cxx11::string_const,int>>>
              ::_M_find_tr<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,void>
                        (this_00,in_RDX);
      bVar6 = cVar3._M_node == (_Base_ptr)(this_00 + 8);
      if (bVar6) {
        *(undefined1 *)&this->entity_type = 0;
      }
      else {
        *(_Rb_tree_color *)&this->entity_type = cVar3._M_node[2]._M_color;
      }
      AVar2 = !bVar6;
      if ((bool)AVar2) {
        this->type = AVar2;
        if (!bVar5) {
          return (optional<int32_t>)(OptionalBase<int>)this;
        }
        goto LAB_001674ef;
      }
      pvVar4 = pvVar4 + 0x10;
      bVar5 = pvVar4 == pvVar1;
    } while (!bVar5);
  }
  this->type = AVar2;
LAB_001674ef:
  this->type = Param;
  *(undefined1 *)&this->entity_type = 0;
  return (optional<int32_t>)(OptionalBase<int>)this;
}

Assistant:

::optional<int32_t> find_constant(const string_view& value) const
        {
            for(auto& e : enums)
            {
                if(auto opt = e->find(value))
                    return opt;
            }
            return nullopt;
        }